

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O2

void __thiscall
amrex::Amr::grid_places
          (Amr *this,int lbase,Real time,int *new_finest,
          Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *new_grids)

{
  long lVar1;
  uint uVar2;
  size_type sVar3;
  long *plVar4;
  ulong uVar5;
  ostream *poVar6;
  Print *pPVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  Box bx;
  BoxList bl;
  
  dVar15 = second();
  if (lbase == 0) {
    AmrMesh::MakeBaseGrids((BoxArray *)&bl,(AmrMesh *)this);
    BoxArray::operator=((new_grids->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>)
                        .super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                        _M_impl.super__Vector_impl_data._M_start,(BoxArray *)&bl);
    BoxArray::~BoxArray((BoxArray *)&bl);
  }
  sVar3 = (this->initial_grids_file)._M_string_length;
  if (sVar3 == 0 || time != 0.0) {
    if (sVar3 != 0) goto LAB_00479614;
  }
  else {
    if ((this->super_AmrCore).super_AmrMesh.super_AmrInfo.use_fixed_coarse_grids == false) {
      uVar2 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
      uVar8 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c + 1;
      if ((int)uVar2 <= (int)uVar8) {
        uVar8 = uVar2;
      }
      uVar5 = (DAT_006e14b8 - initial_ba) / 0x68;
      uVar9 = (ulong)uVar8;
      if ((int)uVar5 <= (int)uVar8) {
        uVar9 = uVar5 & 0xffffffff;
      }
      *new_finest = (int)uVar9;
      for (lVar12 = 1; lVar12 <= (int)uVar9; lVar12 = lVar12 + 1) {
        BoxList::BoxList(&bl);
        plVar4 = *(long **)(lVar12 * 0x68 + -0x20 + initial_ba);
        iVar13 = 0;
        iVar11 = (int)((plVar4[1] - *plVar4) / 0x1c);
        if (iVar11 < 1) {
          iVar11 = 0;
        }
        for (; iVar11 != iVar13; iVar13 = iVar13 + 1) {
          BoxArray::operator[](&bx,(BoxArray *)(initial_ba + (lVar12 + -1) * 0x68),iVar13);
          if (lbase < lVar12) {
            std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
                      ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)&bl,&bx);
          }
        }
        if (lbase < lVar12) {
          BoxArray::define((new_grids->
                           super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                           super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                           _M_impl.super__Vector_impl_data._M_start + lVar12,&bl);
        }
        std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
                  ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&bl);
        uVar9 = (ulong)(uint)*new_finest;
      }
      return;
    }
LAB_00479614:
    if ((this->super_AmrCore).super_AmrMesh.super_AmrInfo.use_fixed_coarse_grids == true) {
      uVar2 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
      uVar8 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c + 1;
      if ((int)uVar2 <= (int)uVar8) {
        uVar8 = uVar2;
      }
      uVar5 = (DAT_006e14b8 - initial_ba) / 0x68;
      uVar9 = (ulong)uVar8;
      if ((int)uVar5 <= (int)uVar8) {
        uVar9 = uVar5 & 0xffffffff;
      }
      *new_finest = (int)uVar9;
      lVar10 = (long)lbase;
      lVar12 = lVar10;
      while (lVar12 < (int)uVar9) {
        lVar1 = lVar12 + 1;
        BoxList::BoxList(&bl);
        plVar4 = *(long **)(initial_ba + 0x48 + lVar12 * 0x68);
        uVar9 = (plVar4[1] - *plVar4) / 0x1c;
        uVar14 = 0;
        uVar5 = uVar9 & 0xffffffff;
        if ((int)uVar9 < 1) {
          uVar5 = uVar14;
        }
        while (iVar11 = (int)uVar14, (int)uVar5 != iVar11) {
          BoxArray::operator[](&bx,(BoxArray *)(initial_ba + lVar12 * 0x68),iVar11);
          if (lVar10 <= lVar12) {
            std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
                      ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)&bl,&bx);
          }
          uVar14 = (ulong)(iVar11 + 1);
        }
        if (lVar10 <= lVar12) {
          BoxArray::define((new_grids->
                           super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                           super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                           _M_impl.super__Vector_impl_data._M_start + lVar1,&bl);
        }
        BoxArray::maxSize((new_grids->
                          super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                          super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar1,
                          (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_grid_size.
                          super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar1);
        std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
                  ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&bl);
        lVar12 = lVar1;
        uVar9 = (ulong)(uint)*new_finest;
      }
      goto LAB_0047984e;
    }
  }
  if ((this->regrid_grids_file)._M_string_length != 0) {
    uVar2 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
    uVar8 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c + 1;
    if ((int)uVar2 <= (int)uVar8) {
      uVar8 = uVar2;
    }
    uVar5 = (DAT_006e14d0 - regrid_ba) / 0x68;
    uVar9 = (ulong)uVar8;
    if ((int)uVar5 <= (int)uVar8) {
      uVar9 = uVar5 & 0xffffffff;
    }
    *new_finest = (int)uVar9;
    for (lVar12 = 1; lVar12 <= (int)uVar9; lVar12 = lVar12 + 1) {
      BoxList::BoxList(&bl);
      plVar4 = *(long **)(lVar12 * 0x68 + -0x20 + regrid_ba);
      iVar13 = 0;
      iVar11 = (int)((plVar4[1] - *plVar4) / 0x1c);
      if (iVar11 < 1) {
        iVar11 = 0;
      }
      for (; iVar11 != iVar13; iVar13 = iVar13 + 1) {
        BoxArray::operator[](&bx,(BoxArray *)(regrid_ba + (lVar12 + -1) * 0x68),iVar13);
        if (lbase < lVar12) {
          std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
                    ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)&bl,&bx);
        }
      }
      if (lbase < lVar12) {
        BoxArray::define((new_grids->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                         ).super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar12,&bl);
      }
      std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
                ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&bl);
      uVar9 = (ulong)(uint)*new_finest;
    }
    return;
  }
LAB_0047984e:
  AmrMesh::MakeNewGrids((AmrMesh *)this,lbase,time,new_finest,new_grids);
  if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
    dVar16 = second();
    poVar6 = OutStream();
    Print::Print((Print *)&bl,poVar6);
    poVar6 = (ostream *)
             &bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    std::operator<<(poVar6,"grid_places() time: ");
    std::ostream::_M_insert<double>(dVar16 - dVar15);
    std::operator<<(poVar6," new finest: ");
    pPVar7 = Print::operator<<((Print *)&bl,new_finest);
    std::operator<<((ostream *)&pPVar7->ss,'\n');
    Print::~Print((Print *)&bl);
  }
  return;
}

Assistant:

void
Amr::grid_places (int              lbase,
                  Real             time,
                  int&             new_finest,
                  Vector<BoxArray>& new_grids)
{
    BL_PROFILE("Amr::grid_places()");

    const auto strttime = amrex::second();

    if (lbase == 0)
    {
        new_grids[0] = MakeBaseGrids();
    }

    if ( time == 0. && !initial_grids_file.empty() && !use_fixed_coarse_grids)
    {
        new_finest = std::min(max_level,(finest_level+1));
        new_finest = std::min<int>(new_finest,initial_ba.size());

        for (int lev = 1; lev <= new_finest; lev++)
        {
            BoxList bl;
            int ngrid = initial_ba[lev-1].size();
            for (int i = 0; i < ngrid; i++)
            {
                Box bx(initial_ba[lev-1][i]);
                if (lev > lbase)
                    bl.push_back(bx);
            }
            if (lev > lbase)
                new_grids[lev].define(bl);
        }
        return;
    }

    // Use grids in initial_grids_file as fixed coarse grids.
    if ( ! initial_grids_file.empty() && use_fixed_coarse_grids)
    {
        new_finest = std::min(max_level,(finest_level+1));
        new_finest = std::min<int>(new_finest,initial_ba.size());

        for (int lev = lbase+1; lev <= new_finest; lev++)
        {
            BoxList bl;
            int ngrid = initial_ba[lev-1].size();
            for (int i = 0; i < ngrid; i++)
            {
                Box bx(initial_ba[lev-1][i]);

                if (lev > lbase)
                    bl.push_back(bx);

            }
            if (lev > lbase)
                new_grids[lev].define(bl);
            new_grids[lev].maxSize(max_grid_size[lev]);
        }
    }
    else if ( !regrid_grids_file.empty() )     // Use grids in regrid_grids_file
    {
        new_finest = std::min(max_level,(finest_level+1));
        new_finest = std::min<int>(new_finest,regrid_ba.size());
        for (int lev = 1; lev <= new_finest; lev++)
        {
            BoxList bl;
            int ngrid = regrid_ba[lev-1].size();
            for (int i = 0; i < ngrid; i++)
            {
                Box bx(regrid_ba[lev-1][i]);
                if (lev > lbase)
                    bl.push_back(bx);
            }
            if (lev > lbase)
                new_grids[lev].define(bl);
        }
        return;
    }

    MakeNewGrids(lbase, time, new_finest, new_grids);

    if (verbose > 0)
    {
        auto stoptime = amrex::second() - strttime;

#ifdef BL_LAZY
        Lazy::QueueReduction( [=] () mutable {
#endif
            ParallelDescriptor::ReduceRealMax(stoptime,ParallelDescriptor::IOProcessorNumber());
            amrex::Print() << "grid_places() time: " << stoptime << " new finest: " << new_finest<< '\n';
#ifdef BL_LAZY
        });
#endif
    }
}